

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O0

Unique<anurbs::Entry<anurbs::Polyline<2L>_>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::Polyline<2l>>,std::__cxx11::string&,std::shared_ptr<anurbs::Polyline<2l>>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          shared_ptr<anurbs::Polyline<2L>_> *args_1,shared_ptr<anurbs::Attributes> *args_2)

{
  shared_ptr<anurbs::Polyline<2L>_> *key;
  Entry<anurbs::Polyline<2L>_> *this_00;
  shared_ptr<anurbs::Attributes> local_48;
  shared_ptr<anurbs::Polyline<2L>_> local_38;
  shared_ptr<anurbs::Attributes> *local_28;
  shared_ptr<anurbs::Attributes> *args_local_2;
  shared_ptr<anurbs::Polyline<2L>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_28 = args_2;
  args_local_2 = (shared_ptr<anurbs::Attributes> *)args_1;
  args_local_1 = (shared_ptr<anurbs::Polyline<2L>_> *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (Entry<anurbs::Polyline<2L>_> *)operator_new(0x48);
  key = args_local_1;
  std::shared_ptr<anurbs::Polyline<2L>_>::shared_ptr
            (&local_38,(shared_ptr<anurbs::Polyline<2L>_> *)args_local_2);
  std::shared_ptr<anurbs::Attributes>::shared_ptr(&local_48,local_28);
  Entry<anurbs::Polyline<2L>_>::Entry(this_00,(string *)key,&local_38,&local_48);
  std::
  unique_ptr<anurbs::Entry<anurbs::Polyline<2l>>,std::default_delete<anurbs::Entry<anurbs::Polyline<2l>>>>
  ::unique_ptr<std::default_delete<anurbs::Entry<anurbs::Polyline<2l>>>,void>
            ((unique_ptr<anurbs::Entry<anurbs::Polyline<2l>>,std::default_delete<anurbs::Entry<anurbs::Polyline<2l>>>>
              *)this,this_00);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr(&local_48);
  std::shared_ptr<anurbs::Polyline<2L>_>::~shared_ptr(&local_38);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::Polyline<2L>_>,_std::default_delete<anurbs::Entry<anurbs::Polyline<2L>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::Polyline<2L>_>,_std::default_delete<anurbs::Entry<anurbs::Polyline<2L>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}